

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::AddInventory(AActor *this,AInventory *item)

{
  DWORD DVar1;
  AActor *pAVar2;
  
  pAVar2 = (item->Owner).field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar2 = (item->Owner).field_0.p;
      if ((pAVar2 != (AActor *)0x0) &&
         (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (item->Owner).field_0.p = (AActor *)0x0;
        pAVar2 = (AActor *)0x0;
      }
      if (pAVar2 == this) {
        return;
      }
      pAVar2 = (item->Owner).field_0.p;
      (*(pAVar2->super_DThinker).super_DObject._vptr_DObject[0x1b])(pAVar2,item);
    }
    else {
      (item->Owner).field_0.p = (AActor *)0x0;
    }
  }
  (item->Owner).field_0.p = this;
  (item->super_AActor).Inventory.field_0 = (this->Inventory).field_0;
  (this->Inventory).field_0.p = item;
  DVar1 = this->InventoryID;
  this->InventoryID = DVar1 + 1;
  (item->super_AActor).InventoryID = DVar1;
  return;
}

Assistant:

void AActor::AddInventory (AInventory *item)
{
	// Check if it's already attached to an actor
	if (item->Owner != NULL)
	{
		// Is it attached to us?
		if (item->Owner == this)
			return;

		// No, then remove it from the other actor first
		item->Owner->RemoveInventory (item);
	}

	item->Owner = this;
	item->Inventory = Inventory;
	Inventory = item;

	// Each item receives an unique ID when added to an actor's inventory.
	// This is used by the DEM_INVUSE command to identify the item. Simply
	// using the item's position in the list won't work, because ticcmds get
	// run sometime in the future, so by the time it runs, the inventory
	// might not be in the same state as it was when DEM_INVUSE was sent.
	Inventory->InventoryID = InventoryID++;
}